

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O2

void __thiscall
Frame::Frame(Frame *this,ClassInstance *object,ClassRuntime *classRuntime,string *methodName,
            string *methodDescriptor,vector<Value,_std::allocator<Value>_> *arguments)

{
  _Rb_tree_header *p_Var1;
  undefined8 *puVar2;
  pointer pVVar3;
  undefined8 uVar4;
  anon_union_8_10_52016fac_for_data aVar5;
  attribute_info *paVar6;
  uint __line;
  u2 uVar7;
  u2 uVar8;
  u2 uVar9;
  Frame *this_00;
  mapped_type *pmVar10;
  method_info *pmVar11;
  int i;
  ulong uVar12;
  char *__assertion;
  long lVar13;
  key_type local_9c;
  stack<Value,_std::deque<Value,_std::allocator<Value>_>_> *local_98;
  ClassRuntime *local_90;
  string *local_88;
  Frame *local_80;
  string *local_78;
  string local_70;
  string local_50;
  
  this->pc = 0;
  this->_object = object;
  (this->_localVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_localVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->_localVariables)._M_t._M_impl.super__Rb_tree_header;
  (this->_localVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_localVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->_localVariables)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98 = &this->_operandStack;
  local_90 = classRuntime;
  local_88 = methodDescriptor;
  local_80 = this;
  local_78 = methodName;
  std::stack<Value,std::deque<Value,std::allocator<Value>>>::
  stack<std::deque<Value,std::allocator<Value>>,void>(local_98);
  lVar13 = 0;
  for (uVar12 = 0;
      pVVar3 = (arguments->super__Vector_base<Value,_std::allocator<Value>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar12 < (ulong)((long)(arguments->super__Vector_base<Value,_std::allocator<Value>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pVVar3 >> 4);
      uVar12 = uVar12 + 1) {
    local_9c = (key_type)uVar12;
    pmVar10 = std::
              map<unsigned_int,_Value,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Value>_>_>
              ::operator[](&this->_localVariables,&local_9c);
    puVar2 = (undefined8 *)((long)&pVVar3->printType + lVar13);
    uVar4 = *puVar2;
    aVar5 = *(anon_union_8_10_52016fac_for_data *)(puVar2 + 1);
    pmVar10->printType = (int)uVar4;
    pmVar10->type = (int)((ulong)uVar4 >> 0x20);
    pmVar10->data = aVar5;
    lVar13 = lVar13 + 0x10;
  }
  std::__cxx11::string::string((string *)&local_50,(string *)local_78);
  std::__cxx11::string::string((string *)&local_70,(string *)local_88);
  this_00 = local_80;
  pmVar11 = getMethodNamed(local_80,local_90,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  if (pmVar11 == (method_info *)0x0) {
    __assertion = "method != NULL";
    __line = 0x13;
  }
  else {
    uVar7 = pmVar11->name_index;
    uVar8 = pmVar11->descriptor_index;
    uVar9 = pmVar11->attributes_count;
    paVar6 = pmVar11->attributes;
    (this_00->_method).access_flags = pmVar11->access_flags;
    (this_00->_method).name_index = uVar7;
    (this_00->_method).descriptor_index = uVar8;
    (this_00->_method).attributes_count = uVar9;
    (this_00->_method).attributes = paVar6;
    if (((this_00->_method).access_flags & 8) == 0) {
      findAttributes(this_00);
      return;
    }
    __assertion = "(_method.access_flags & 0x0008) == 0";
    __line = 0x15;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/frame.cpp",
                __line,
                "Frame::Frame(ClassInstance *, ClassRuntime *, string, string, vector<Value>)");
}

Assistant:

Frame::Frame(ClassInstance *object, ClassRuntime *classRuntime, string methodName, string methodDescriptor, vector<Value> arguments) : pc(0), _object(object) {
    
    for (int i = 0; i < arguments.size(); i++) {
        _localVariables[i] = arguments[i];
    }
    
    method_info *method = getMethodNamed(classRuntime, methodName, methodDescriptor);
    assert(method != NULL);
    _method = *method;
    assert((_method.access_flags & 0x0008) == 0); // o método não pode ser estático
    
    findAttributes();
}